

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void concatFuncCore(sqlite3_context *context,int argc,sqlite3_value **argv,int nSep,char *zSep)

{
  int iVar1;
  sqlite3_context *pCtx;
  void *n_00;
  size_t __n;
  int in_ECX;
  int in_ESI;
  void *in_R8;
  char *v;
  char *z;
  int i;
  i64 n;
  i64 k;
  i64 j;
  _func_void_void_ptr *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  long lVar3;
  long local_30;
  
  lVar3 = 0;
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    iVar1 = sqlite3_value_bytes((sqlite3_value *)0x226cde);
    lVar3 = iVar1 + lVar3;
  }
  pCtx = (sqlite3_context *)((long)(in_ESI + -1) * (long)in_ECX + lVar3);
  n_00 = sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffffa8);
  if (n_00 == (void *)0x0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x226d38);
  }
  else {
    local_30 = 0;
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      iVar1 = sqlite3_value_bytes((sqlite3_value *)0x226d6f);
      __n = (size_t)iVar1;
      if ((0 < (long)__n) &&
         (in_stack_ffffffffffffffa8 =
               (_func_void_void_ptr *)sqlite3_value_text((sqlite3_value *)0x226d91),
         in_stack_ffffffffffffffa8 != (_func_void_void_ptr *)0x0)) {
        if ((0 < local_30) && (0 < in_ECX)) {
          memcpy((void *)((long)n_00 + local_30),in_R8,(long)in_ECX);
          local_30 = in_ECX + local_30;
        }
        memcpy((void *)((long)n_00 + local_30),in_stack_ffffffffffffffa8,__n);
        local_30 = __n + local_30;
      }
    }
    *(undefined1 *)((long)n_00 + local_30) = 0;
    sqlite3_result_text64
              (pCtx,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),(sqlite3_uint64)n_00,
               in_stack_ffffffffffffffa8,'\0');
  }
  return;
}

Assistant:

static void concatFuncCore(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  int nSep,
  const char *zSep
){
  i64 j, k, n = 0;
  int i;
  char *z;
  for(i=0; i<argc; i++){
    n += sqlite3_value_bytes(argv[i]);
  }
  n += (argc-1)*(i64)nSep;
  z = sqlite3_malloc64(n+1);
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  j = 0;
  for(i=0; i<argc; i++){
    k = sqlite3_value_bytes(argv[i]);
    if( k>0 ){
      const char *v = (const char*)sqlite3_value_text(argv[i]);
      if( v!=0 ){
        if( j>0 && nSep>0 ){
          memcpy(&z[j], zSep, nSep);
          j += nSep;
        }
        memcpy(&z[j], v, k);
        j += k;
      }
    }
  }
  z[j] = 0;
  assert( j<=n );
  sqlite3_result_text64(context, z, j, sqlite3_free, SQLITE_UTF8);
}